

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_siz_dumpparms(jpc_ms_t *ms,FILE *out)

{
  jpc_sizcomp_t *pjVar1;
  ulong uVar2;
  
  fprintf((FILE *)out,"caps = 0x%02lx;\n",(ms->parms).sot.tileno);
  fprintf((FILE *)out,"width = %lu; height = %lu; xoff = %lu; yoff = %lu;\n",(ms->parms).sot.len,
          (ms->parms).siz.height,(ms->parms).siz.xoff,(ms->parms).siz.yoff);
  fprintf((FILE *)out,"tilewidth = %lu; tileheight = %lu; tilexoff = %lu; tileyoff = %lu;\n",
          (ms->parms).siz.tilewidth,(ms->parms).siz.tileheight,(ms->parms).siz.tilexoff,
          (ms->parms).siz.tileyoff);
  fprintf((FILE *)out,"numcomps = %lu;\n",(ms->parms).siz.numcomps);
  if ((ms->parms).siz.numcomps != 0) {
    uVar2 = 0;
    do {
      pjVar1 = (ms->parms).siz.comps;
      fprintf((FILE *)out,"prec[%d] = %d; sgnd[%d] = %d; hsamp[%d] = %d; vsamp[%d] = %d\n",uVar2,
              (ulong)pjVar1[uVar2].prec,uVar2,(ulong)pjVar1[uVar2].sgnd,uVar2,
              (ulong)pjVar1[uVar2].hsamp,uVar2,(ulong)pjVar1[uVar2].vsamp);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < (ms->parms).siz.numcomps);
  }
  return 0;
}

Assistant:

static int jpc_siz_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_siz_t *siz = &ms->parms.siz;
	unsigned int i;
	fprintf(out, "caps = 0x%02"PRIxFAST16";\n", siz->caps);
	fprintf(out, "width = %"PRIuFAST32"; height = %"PRIuFAST32"; xoff = %"PRIuFAST32"; yoff = %" PRIuFAST32 ";\n",
	  siz->width, siz->height, siz->xoff, siz->yoff);
	fprintf(out, "tilewidth = %"PRIuFAST32"; tileheight = %"PRIuFAST32"; "
	  "tilexoff = %"PRIuFAST32"; tileyoff = %" PRIuFAST32 ";\n",
	  siz->tilewidth, siz->tileheight, siz->tilexoff, siz->tileyoff);
	fprintf(out, "numcomps = %"PRIuFAST16";\n", siz->numcomps);
	for (i = 0; i < siz->numcomps; ++i) {
		fprintf(out, "prec[%d] = %d; sgnd[%d] = %d; hsamp[%d] = %d; "
		  "vsamp[%d] = %d\n", i, siz->comps[i].prec, i,
		  siz->comps[i].sgnd, i, siz->comps[i].hsamp, i,
		  siz->comps[i].vsamp);
	}
	return 0;
}